

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void processIncludeDirectories
               (cmGeneratorTarget *tgt,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *entries,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *includes,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *uniqueIncludes,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugIncludes,string *language)

{
  cmLinkImplItem *this;
  cmGeneratorTarget *pcVar1;
  cmLocalGenerator *pcVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  PolicyStatus PVar6;
  undefined7 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar7;
  string *psVar8;
  long *plVar9;
  cmake *this_00;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar10;
  size_type *psVar11;
  PolicyID id;
  PolicyID id_00;
  pointer filename;
  MessageType MVar12;
  __hashtable *__h;
  pointer ppTVar13;
  bool bVar14;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar15;
  string usedIncludes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryIncludes;
  string inc;
  undefined1 local_2b0 [32];
  cmGeneratorTarget *local_290;
  undefined4 local_284;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 *local_260;
  long local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  TargetPropertyEntry *local_240;
  string *local_238;
  PolicyMap *local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  long *local_208 [2];
  long local_1f8 [2];
  pointer local_1e8;
  cmGeneratorExpressionDAGChecker *local_1e0;
  string *local_1d8;
  pointer local_1d0;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_1c8;
  string *local_1c0;
  cmListFileBacktrace local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  ppTVar13 = (entries->
             super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_1e8 = (entries->
              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar13 != local_1e8) {
    local_230 = &tgt->PolicyMap;
    local_290 = tgt;
    local_1e0 = dagChecker;
    local_1d8 = config;
    local_1c8 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                includes;
    do {
      local_240 = *ppTVar13;
      this = local_240->LinkImplItem;
      local_238 = cmLinkItem::AsStr_abi_cxx11_(&this->super_cmLinkItem);
      pcVar1 = (this->super_cmLinkItem).Target;
      if (pcVar1 == (cmGeneratorTarget *)0x0) {
        local_284 = 0;
      }
      else {
        bVar4 = cmTarget::IsImported(pcVar1->Target);
        local_284 = (undefined4)CONCAT71(extraout_var,bVar4);
      }
      bVar4 = this->FromGenex;
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar5 = (*local_240->_vptr_TargetPropertyEntry[3])
                        (local_240,local_290->LocalGenerator,local_1d8,0,local_290,local_1e0,
                         language);
      cmSystemTools::ExpandListArgument((string *)CONCAT44(extraout_var_00,iVar5),&local_228,false);
      local_260 = &local_250;
      local_258 = 0;
      local_250 = 0;
      local_1c0 = local_228.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      bVar14 = local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      filename = local_228.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_1d0 = ppTVar13;
      while (!bVar14) {
        if (((char)local_284 != '\0') &&
           (bVar14 = cmsys::SystemTools::FileExists(filename), !bVar14)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          MVar12 = FATAL_ERROR;
          if (bVar4 != false) {
            PVar6 = cmPolicies::PolicyMap::Get(local_230,CMP0027);
            if (PVar6 != OLD) {
              if (PVar6 != WARN) goto LAB_002bf994;
              cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_2b0,(cmPolicies *)0x1b,id_00);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(char *)local_2b0._0_8_,local_2b0._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2b0._0_8_ !=
                  (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_2b0 + 0x10)) {
                operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
              }
            }
            MVar12 = AUTHOR_WARNING;
          }
LAB_002bf994:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Imported target \"",0x11);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(local_238->_M_dataplus)._M_p,
                              local_238->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"\" includes non-existent path\n  \"",0x20);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(filename->_M_dataplus)._M_p,filename->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                     ,0x114);
          pcVar2 = local_290->LocalGenerator;
          std::__cxx11::stringbuf::str();
          cmLocalGenerator::IssueMessage(pcVar2,MVar12,(string *)local_2b0);
          if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2b0._0_8_ !=
              (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2b0 + 0x10)) {
            operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
          }
LAB_002bfa49:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          if (local_260 != &local_250) {
            operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_228);
          return;
        }
        bVar14 = cmsys::SystemTools::FileIsFullPath(filename);
        if (!bVar14) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          if (local_238->_M_string_length == 0) {
            PVar6 = cmPolicies::PolicyMap::Get(local_230,CMP0021);
            MVar12 = FATAL_ERROR;
            if (PVar6 == OLD) {
              bVar14 = true;
            }
            else {
              if (PVar6 == WARN) {
                cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_2b0,(cmPolicies *)0x15,id);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,(char *)local_2b0._0_8_,local_2b0._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
                if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2b0._0_8_ !=
                    (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_2b0 + 0x10)) {
                  operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
                }
                MVar12 = AUTHOR_WARNING;
              }
              bVar14 = false;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "Found relative path while evaluating include directories of \"",0x3d);
            psVar8 = cmTarget::GetName_abi_cxx11_(local_290->Target);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(psVar8->_M_dataplus)._M_p,
                                psVar8->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\":\n  \"",6);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(filename->_M_dataplus)._M_p,filename->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(local_238->_M_dataplus)._M_p,
                                local_238->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,
                       "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \"",0x42)
            ;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(filename->_M_dataplus)._M_p,filename->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
            MVar12 = FATAL_ERROR;
            bVar14 = false;
          }
          if (!bVar14) {
            pcVar2 = local_290->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(pcVar2,MVar12,(string *)local_2b0);
            if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2b0._0_8_ !=
                (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2b0 + 0x10)) {
              operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
            }
            if (MVar12 == FATAL_ERROR) goto LAB_002bfa49;
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        bVar14 = cmSystemTools::IsOff(filename);
        if (!bVar14) {
          cmsys::SystemTools::ConvertToUnixSlashes(filename);
        }
        pcVar3 = (filename->_M_dataplus)._M_p;
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pcVar3,pcVar3 + filename->_M_string_length);
        local_2b0._0_8_ = uniqueIncludes;
        pVar15 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::
                 _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)uniqueIncludes,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1a8,local_2b0);
        if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          (*local_240->_vptr_TargetPropertyEntry[4])((cmListFileBacktrace *)local_2b0);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string&,cmListFileBacktrace>
                    (local_1c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     (cmListFileBacktrace *)local_2b0);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_);
          }
          if (debugIncludes) {
            std::operator+(&local_280," * ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_280);
            local_2b0._0_8_ = local_2b0 + 0x10;
            puVar10 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(plVar9 + 2);
            if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)*plVar9 == puVar10) {
              local_2b0._16_8_ = (puVar10->_M_h)._M_buckets;
              local_2b0._24_8_ = plVar9[3];
            }
            else {
              local_2b0._16_8_ = (puVar10->_M_h)._M_buckets;
              local_2b0._0_8_ =
                   (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)*plVar9;
            }
            local_2b0._8_8_ = plVar9[1];
            *plVar9 = (long)puVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_260,local_2b0._0_8_);
            if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2b0._0_8_ !=
                (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2b0 + 0x10)) {
              operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        filename = filename + 1;
        bVar14 = filename == local_1c0;
      }
      if (local_258 != 0) {
        this_00 = cmLocalGenerator::GetCMakeInstance(local_290->LocalGenerator);
        local_208[0] = local_1f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_208,"Used includes for target ","");
        psVar8 = cmTarget::GetName_abi_cxx11_(local_290->Target);
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_208,(ulong)(psVar8->_M_dataplus)._M_p);
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_280.field_2._M_allocated_capacity = *psVar11;
          local_280.field_2._8_8_ = plVar9[3];
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        }
        else {
          local_280.field_2._M_allocated_capacity = *psVar11;
          local_280._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_280._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_280);
        local_2b0._0_8_ = local_2b0 + 0x10;
        puVar10 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(plVar9 + 2);
        if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)*plVar9 == puVar10) {
          local_2b0._16_8_ = (puVar10->_M_h)._M_buckets;
          local_2b0._24_8_ = plVar9[3];
        }
        else {
          local_2b0._16_8_ = (puVar10->_M_h)._M_buckets;
          local_2b0._0_8_ =
               (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)*plVar9;
        }
        local_2b0._8_8_ = plVar9[1];
        *plVar9 = (long)puVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append(local_2b0,(ulong)local_260);
        local_1a8._0_8_ = local_1a8 + 0x10;
        psVar11 = (size_type *)(plVar9 + 2);
        if ((size_type *)*plVar9 == psVar11) {
          local_1a8._16_8_ = *psVar11;
          local_1a8._24_4_ = (undefined4)plVar9[3];
          local_1a8._28_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
        }
        else {
          local_1a8._16_8_ = *psVar11;
          local_1a8._0_8_ = (size_type *)*plVar9;
        }
        local_1a8._8_8_ = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        (*local_240->_vptr_TargetPropertyEntry[4])(&local_1b8);
        cmake::IssueMessage(this_00,LOG,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1a8,&local_1b8);
        if (local_1b8.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1b8.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2b0._0_8_ !=
            (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2b0 + 0x10)) {
          operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
        if (local_208[0] != local_1f8) {
          operator_delete(local_208[0],local_1f8[0] + 1);
        }
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_228);
      ppTVar13 = local_1d0 + 1;
    } while ((bool)(bVar14 & ppTVar13 != local_1e8));
  }
  return;
}

Assistant:

static void processIncludeDirectories(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<BT<std::string>>& includes,
  std::unordered_set<std::string>& uniqueIncludes,
  cmGeneratorExpressionDAGChecker* dagChecker, const std::string& config,
  bool debugIncludes, const std::string& language)
{
  for (cmGeneratorTarget::TargetPropertyEntry* entry : entries) {
    cmLinkImplItem const& item = entry->LinkImplItem;
    std::string const& targetName = item.AsStr();
    bool const fromImported = item.Target && item.Target->IsImported();
    bool const checkCMP0027 = item.FromGenex;
    std::vector<std::string> entryIncludes;
    cmSystemTools::ExpandListArgument(entry->Evaluate(tgt->GetLocalGenerator(),
                                                      config, false, tgt,
                                                      dagChecker, language),
                                      entryIncludes);

    std::string usedIncludes;
    for (std::string& entryInclude : entryIncludes) {
      if (fromImported && !cmSystemTools::FileExists(entryInclude)) {
        std::ostringstream e;
        MessageType messageType = MessageType::FATAL_ERROR;
        if (checkCMP0027) {
          switch (tgt->GetPolicyStatusCMP0027()) {
            case cmPolicies::WARN:
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0027) << "\n";
              CM_FALLTHROUGH;
            case cmPolicies::OLD:
              messageType = MessageType::AUTHOR_WARNING;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
          }
        }
        /* clang-format off */
        e << "Imported target \"" << targetName << "\" includes "
             "non-existent path\n  \"" << entryInclude << "\"\nin its "
             "INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n"
             "* The path was deleted, renamed, or moved to another "
             "location.\n"
             "* An install or uninstall procedure did not complete "
             "successfully.\n"
             "* The installation package was faulty and references files it "
             "does not provide.\n";
        /* clang-format on */
        tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
        return;
      }

      if (!cmSystemTools::FileIsFullPath(entryInclude)) {
        std::ostringstream e;
        bool noMessage = false;
        MessageType messageType = MessageType::FATAL_ERROR;
        if (!targetName.empty()) {
          /* clang-format off */
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_INCLUDE_DIRECTORIES:\n"
            "  \"" << entryInclude << "\"";
          /* clang-format on */
        } else {
          switch (tgt->GetPolicyStatusCMP0021()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0021) << "\n";
              messageType = MessageType::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }
          e << "Found relative path while evaluating include directories of "
               "\""
            << tgt->GetName() << "\":\n  \"" << entryInclude << "\"\n";
        }
        if (!noMessage) {
          tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
          if (messageType == MessageType::FATAL_ERROR) {
            return;
          }
        }
      }

      if (!cmSystemTools::IsOff(entryInclude)) {
        cmSystemTools::ConvertToUnixSlashes(entryInclude);
      }
      std::string inc = entryInclude;

      if (uniqueIncludes.insert(inc).second) {
        includes.emplace_back(inc, entry->GetBacktrace());
        if (debugIncludes) {
          usedIncludes += " * " + inc + "\n";
        }
      }
    }
    if (!usedIncludes.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used includes for target ") + tgt->GetName() + ":\n" +
          usedIncludes,
        entry->GetBacktrace());
    }
  }
}